

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

void __thiscall
spvtools::opt::IRContext::AddDebug2Inst
          (IRContext *this,
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          *d)

{
  bool bVar1;
  Op OVar2;
  pointer this_00;
  DefUseManager *this_01;
  pointer pIVar3;
  Module *this_02;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_48;
  _Base_ptr local_40;
  pointer local_38;
  uint32_t local_2c;
  pair<const_unsigned_int,_spvtools::opt::Instruction_*> local_28;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *local_18
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *d_local;
  IRContext *this_local;
  
  local_18 = d;
  d_local = (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             *)this;
  bVar1 = AreAnalysesValid(this,kAnalysisNameMap);
  if (bVar1) {
    pIVar3 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::operator->(local_18);
    OVar2 = opt::Instruction::opcode(pIVar3);
    if (OVar2 != OpName) {
      pIVar3 = std::
               unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ::operator->(local_18);
      OVar2 = opt::Instruction::opcode(pIVar3);
      if (OVar2 != OpMemberName) goto LAB_0099ef72;
    }
    this_00 = std::
              unique_ptr<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
              ::operator->(&this->id_to_name_);
    pIVar3 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::operator->(local_18);
    local_2c = opt::Instruction::GetSingleWordInOperand(pIVar3,0);
    local_38 = std::
               unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ::get(local_18);
    std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>::
    pair<unsigned_int,_spvtools::opt::Instruction_*,_true>(&local_28,&local_2c,&local_38);
    local_40 = (_Base_ptr)
               std::
               multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
               ::insert(this_00,&local_28);
  }
LAB_0099ef72:
  bVar1 = AreAnalysesValid(this,kAnalysisBegin);
  if (bVar1) {
    this_01 = get_def_use_mgr(this);
    pIVar3 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::get(local_18);
    analysis::DefUseManager::AnalyzeInstDefUse(this_01,pIVar3);
  }
  this_02 = module(this);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  unique_ptr(&local_48,local_18);
  Module::AddDebug2Inst(this_02,&local_48);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_48);
  return;
}

Assistant:

void IRContext::AddDebug2Inst(std::unique_ptr<Instruction>&& d) {
  if (AreAnalysesValid(kAnalysisNameMap)) {
    if (d->opcode() == spv::Op::OpName ||
        d->opcode() == spv::Op::OpMemberName) {
      // OpName and OpMemberName do not have result-ids. The target of the
      // instruction is at InOperand index 0.
      id_to_name_->insert({d->GetSingleWordInOperand(0), d.get()});
    }
  }
  if (AreAnalysesValid(kAnalysisDefUse)) {
    get_def_use_mgr()->AnalyzeInstDefUse(d.get());
  }
  module()->AddDebug2Inst(std::move(d));
}